

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O1

int Abc_ObjCheckAbsorb(Abc_Obj_t *pObj,Abc_Obj_t *pPivot,int nLutSize,Vec_Ptr_t *vFanins)

{
  uint uVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  void *pvVar4;
  void **ppvVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  if (((*(uint *)&pObj->field_0x14 & 0xf) != 7) || ((*(uint *)&pPivot->field_0x14 & 0xf) != 7)) {
    __assert_fail("Abc_ObjIsNode(pObj) && Abc_ObjIsNode(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLutmin.c"
                  ,0x3d,"int Abc_ObjCheckAbsorb(Abc_Obj_t *, Abc_Obj_t *, int, Vec_Ptr_t *)");
  }
  vFanins->nSize = 0;
  if (0 < (pObj->vFanins).nSize) {
    lVar8 = 0;
    do {
      pAVar3 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar8]];
      if (pAVar3 != pPivot) {
        uVar1 = vFanins->nCap;
        if (vFanins->nSize == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (vFanins->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(vFanins->pArray,0x80);
            }
            vFanins->pArray = ppvVar5;
            iVar7 = 0x10;
          }
          else {
            iVar7 = uVar1 * 2;
            if (iVar7 <= (int)uVar1) goto LAB_00269156;
            if (vFanins->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(vFanins->pArray,(ulong)uVar1 << 4);
            }
            vFanins->pArray = ppvVar5;
          }
          vFanins->nCap = iVar7;
        }
LAB_00269156:
        iVar7 = vFanins->nSize;
        vFanins->nSize = iVar7 + 1;
        vFanins->pArray[iVar7] = pAVar3;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pObj->vFanins).nSize);
  }
  if (0 < (pPivot->vFanins).nSize) {
    lVar8 = 0;
    do {
      pvVar4 = pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar8]];
      uVar1 = vFanins->nSize;
      if (0 < (long)(int)uVar1) {
        lVar6 = 0;
        do {
          if (vFanins->pArray[lVar6] == pvVar4) goto LAB_00269235;
          lVar6 = lVar6 + 1;
        } while ((int)uVar1 != lVar6);
      }
      uVar2 = vFanins->nCap;
      if (uVar1 == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vFanins->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vFanins->pArray,0x80);
          }
          vFanins->pArray = ppvVar5;
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar2 * 2;
          if (iVar7 <= (int)uVar2) goto LAB_00269223;
          if (vFanins->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vFanins->pArray,(ulong)uVar2 << 4);
          }
          vFanins->pArray = ppvVar5;
        }
        vFanins->nCap = iVar7;
      }
LAB_00269223:
      iVar7 = vFanins->nSize;
      vFanins->nSize = iVar7 + 1;
      vFanins->pArray[iVar7] = pvVar4;
LAB_00269235:
      if (nLutSize < vFanins->nSize) {
        return 0;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (pPivot->vFanins).nSize);
  }
  return 1;
}

Assistant:

int Abc_ObjCheckAbsorb( Abc_Obj_t * pObj, Abc_Obj_t * pPivot, int nLutSize, Vec_Ptr_t * vFanins )
{
    Abc_Obj_t * pFanin;
    int i;
    assert( Abc_ObjIsNode(pObj) && Abc_ObjIsNode(pPivot) );
    // add fanins of the node
    Vec_PtrClear( vFanins );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        if ( pFanin != pPivot )
            Vec_PtrPush( vFanins, pFanin );
    // add fanins of the fanin
    Abc_ObjForEachFanin( pPivot, pFanin, i )
    {
        Vec_PtrPushUnique( vFanins, pFanin );
        if ( Vec_PtrSize(vFanins) > nLutSize )
            return 0;
    }
    return 1;
}